

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  uint uVar2;
  PolicyStatus PVar3;
  int iVar4;
  ostream *poVar5;
  cmake *this_00;
  reference this_01;
  pointer this_02;
  cmMakefile *this_03;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pcVar6;
  reference this_04;
  pointer this_05;
  reference pbVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  bool local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_2b0;
  string local_290;
  allocator<char> local_269;
  string local_268;
  string local_248;
  reference local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
  *__range1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  string local_1f8;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  ostringstream msg;
  string local_30;
  cmGlobalNinjaGenerator *local_10;
  cmGlobalNinjaGenerator *this_local;
  
  local_10 = this;
  RequiredNinjaVersion_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    poVar5 = std::operator<<((ostream *)local_1b8,"The detected version of Ninja (");
    std::operator<<(poVar5,(string *)&this->NinjaVersion);
    std::operator<<((ostream *)local_1b8,") is less than the version of Ninja required by CMake (");
    RequiredNinjaVersion_abi_cxx11_();
    poVar5 = std::operator<<((ostream *)local_1b8,local_1d8);
    std::operator<<(poVar5,").");
    std::__cxx11::string::~string(local_1d8);
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    std::__cxx11::ostringstream::str();
    __range1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                *)0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range1);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1f8,(cmListFileBacktrace *)&__range1);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range1);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  }
  else {
    InitOutputPathPrefix(this);
    uVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x4e])();
    if (((uVar2 & 1) != 0) && (bVar1 = OpenRulesFileStream(this), bVar1)) {
      __end1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
               ::begin(&this->Configs);
      it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
              ::end(&this->Configs);
      while (bVar1 = std::operator!=(&__end1,(_Self *)&it), bVar1) {
        local_228 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>
                    ::operator*(&__end1);
        std::
        map<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,_std::allocator<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::clear(&(local_228->second).TargetDependsClosures);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>
        ::operator++(&__end1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"all",&local_269);
      NinjaOutputPath(&local_248,this,&local_268);
      std::__cxx11::string::operator=((string *)&this->TargetAll,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"CMakeCache.txt",(allocator<char> *)((long)&__range2 + 7));
      NinjaOutputPath(&local_290,this,&local_2b0);
      std::__cxx11::string::operator=((string *)&this->CMakeCacheFile,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      this->DiagnosedCxxModuleNinjaSupport = false;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this->super_cmGlobalCommonGenerator).ClangTidyExportFixesDirs);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this->super_cmGlobalCommonGenerator).ClangTidyExportFixesFiles);
      this_01 = std::
                vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                              LocalGenerators,0);
      this_02 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                operator->(this_01);
      this_03 = cmLocalGenerator::GetMakefile(this_02);
      PVar3 = cmMakefile::GetPolicyStatus(this_03,CMP0058,false);
      this->PolicyCMP0058 = PVar3;
      local_349 = true;
      if (this->PolicyCMP0058 != OLD) {
        local_349 = this->PolicyCMP0058 == WARN;
      }
      this->ComputingUnknownDependencies = local_349;
      cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
      WriteAssumedSourceDependencies(this);
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])();
      WriteTargetAliases(this,(ostream *)CONCAT44(extraout_var,iVar4));
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])();
      WriteFolderTargets(this,(ostream *)CONCAT44(extraout_var_00,iVar4));
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])();
      WriteUnknownExplicitDependencies(this,(ostream *)CONCAT44(extraout_var_01,iVar4));
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])();
      WriteBuiltinTargets(this,(ostream *)CONCAT44(extraout_var_02,iVar4));
      bVar1 = cmSystemTools::GetErrorOccurredFlag();
      if (bVar1) {
        pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator->(&this->RulesFileStream);
        std::ios::setstate((int)pcVar6 +
                           (int)(pcVar6->super_ofstream).
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream[-3]);
        this_04 = std::
                  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                  ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                                Makefiles,0);
        this_05 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_04)
        ;
        cmMakefile::GetGeneratorConfigs_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin2,this_05,IncludeEmptyConfig);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin2);
        config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&config), bVar1) {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
          iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x45])(this,pbVar7);
          std::ios::setstate(iVar4 + (int)*(undefined8 *)
                                           (*(long *)CONCAT44(extraout_var_03,iVar4) + -0x18));
          iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x46])(this,pbVar7);
          std::ios::setstate(iVar4 + (int)*(undefined8 *)
                                           (*(long *)CONCAT44(extraout_var_04,iVar4) + -0x18));
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__begin2);
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x48])();
        std::ios::setstate(iVar4 + (int)*(undefined8 *)
                                         (*(long *)CONCAT44(extraout_var_05,iVar4) + -0x18));
      }
      CloseCompileCommandsStream(this);
      CloseRulesFileStream(this);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4f])
                ();
      CleanMetaData(this);
      cmGlobalCommonGenerator::RemoveUnknownClangTidyExportFixesFiles
                (&this->super_cmGlobalCommonGenerator);
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                    RequiredNinjaVersion())) {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << cmGlobalNinjaGenerator::RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           msg.str());
    return;
  }
  this->InitOutputPathPrefix();
  if (!this->OpenBuildFileStreams()) {
    return;
  }
  if (!this->OpenRulesFileStream()) {
    return;
  }

  for (auto& it : this->Configs) {
    it.second.TargetDependsClosures.clear();
  }

  this->TargetAll = this->NinjaOutputPath("all");
  this->CMakeCacheFile = this->NinjaOutputPath("CMakeCache.txt");
  this->DiagnosedCxxModuleNinjaSupport = false;
  this->ClangTidyExportFixesDirs.clear();
  this->ClangTidyExportFixesFiles.clear();

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()->GetPolicyStatus(
      cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->GetCommonFileStream());
  this->WriteFolderTargets(*this->GetCommonFileStream());
  this->WriteUnknownExplicitDependencies(*this->GetCommonFileStream());
  this->WriteBuiltinTargets(*this->GetCommonFileStream());

  if (cmSystemTools::GetErrorOccurredFlag()) {
    this->RulesFileStream->setstate(std::ios::failbit);
    for (auto const& config : this->Makefiles[0]->GetGeneratorConfigs(
           cmMakefile::IncludeEmptyConfig)) {
      this->GetImplFileStream(config)->setstate(std::ios::failbit);
      this->GetConfigFileStream(config)->setstate(std::ios::failbit);
    }
    this->GetCommonFileStream()->setstate(std::ios::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStreams();

#ifdef _WIN32
  // Older ninja tools will not be able to update metadata on Windows
  // when we are re-generating inside an existing 'ninja' invocation
  // because the outer tool has the files open for write.
  if (this->NinjaSupportsMetadataOnRegeneration ||
      !this->GetCMakeInstance()->GetRegenerateDuringBuild())
#endif
  {
    this->CleanMetaData();
  }

  this->RemoveUnknownClangTidyExportFixesFiles();
}